

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O0

void __thiscall
Reset_hasResetFromComponentMethod_Test::TestBody(Reset_hasResetFromComponentMethod_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  char *pcVar5;
  AssertionResult local_168 [2];
  AssertHelper local_148 [8];
  Message local_140 [15];
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_100 [8];
  Message local_f8 [15];
  bool local_e9;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_;
  ResetPtr r3;
  string local_c0 [32];
  undefined1 local_a0 [8];
  ResetPtr r2;
  string local_88 [32];
  undefined1 local_68 [8];
  ResetPtr r1;
  ComponentPtr c;
  allocator<char> local_31;
  string local_30 [8];
  string in;
  Reset_hasResetFromComponentMethod_Test *this_local;
  
  in.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"valid_name",&local_31);
  std::allocator<char>::~allocator(&local_31);
  libcellml::Component::create();
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&r1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::NamedEntity::setName((string *)peVar3);
  libcellml::Reset::create();
  peVar4 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"r1s test value",
             (allocator<char> *)
             ((long)&r2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Reset::setTestValue((string *)peVar4);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&r2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&r1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addReset((shared_ptr *)peVar3);
  libcellml::Reset::create();
  peVar4 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"r2s test value",
             (allocator<char> *)
             ((long)&r3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Reset::setTestValue((string *)peVar4);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&r3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&r1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addReset((shared_ptr *)peVar3);
  libcellml::Reset::create();
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&r1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  bVar1 = libcellml::Component::hasReset((shared_ptr *)peVar3);
  local_e9 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e8,&local_e9,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar2) {
    testing::Message::Message(local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_e8,"c->hasReset(r2)","false");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0x171,pcVar5);
    testing::internal::AssertHelper::operator=(local_100,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_100);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&r1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  bVar1 = libcellml::Component::hasReset((shared_ptr *)peVar3);
  local_131 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_168,local_130,"c->hasReset(r3)","true");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0x172,pcVar5);
    testing::internal::AssertHelper::operator=(local_148,local_140);
    testing::internal::AssertHelper::~AssertHelper(local_148);
    std::__cxx11::string::~string((string *)local_168);
    testing::Message::~Message(local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  std::shared_ptr<libcellml::Reset>::~shared_ptr
            ((shared_ptr<libcellml::Reset> *)&gtest_ar_.message_);
  std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)local_a0);
  std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)local_68);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &r1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Reset, hasResetFromComponentMethod)
{
    const std::string in = "valid_name";
    libcellml::ComponentPtr c = libcellml::Component::create();
    c->setName(in);

    libcellml::ResetPtr r1 = libcellml::Reset::create();
    r1->setTestValue("r1s test value");
    c->addReset(r1);

    libcellml::ResetPtr r2 = libcellml::Reset::create();
    r2->setTestValue("r2s test value");
    c->addReset(r2);

    libcellml::ResetPtr r3 = libcellml::Reset::create();

    EXPECT_TRUE(c->hasReset(r2));
    EXPECT_FALSE(c->hasReset(r3));
}